

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolution_x86.cpp
# Opt level: O1

int __thiscall
ncnn::Deconvolution_x86::forward
          (Deconvolution_x86 *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  uint i;
  pointer pMVar1;
  int *piVar2;
  long *plVar3;
  Deconvolution_x86 *pDVar4;
  void *pvVar5;
  Layer *pLVar6;
  long lVar7;
  void *pvVar8;
  ulong uVar9;
  ulong uVar10;
  int iVar11;
  void *pvVar12;
  ulong uVar13;
  void *pvVar14;
  uint uVar15;
  ulong uVar16;
  uint uVar17;
  ParamDict pd;
  ParamDict local_200;
  int local_1f0;
  int local_1ec;
  Mat local_1e8;
  Mat local_198;
  Deconvolution_x86 *local_150;
  Mat local_148;
  undefined1 auStack_100 [8];
  undefined1 local_f8 [8];
  pointer local_f0;
  pointer local_e8;
  undefined1 local_e0 [8];
  ModelBinFromMatArray local_d8;
  Mat local_c8;
  void *local_80;
  undefined4 uStack_78;
  undefined4 uStack_74;
  undefined8 uStack_70;
  int iStack_68;
  Allocator *local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  int local_48;
  size_t local_40;
  
  pMVar1 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  local_e8 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
  local_1ec = pMVar1[1].w;
  uVar17 = pMVar1->elempack * pMVar1->c;
  local_1f0 = pMVar1[1].h;
  i = pMVar1[1].d;
  local_148.cstep = 0;
  local_148.data = (void *)0x0;
  local_148.refcount._0_4_ = 0;
  local_148.refcount._4_4_ = 0;
  local_148.elemsize._0_4_ = 0;
  local_148.elemsize._4_4_ = 0;
  local_148.elempack = 0;
  local_148.allocator = (Allocator *)0x0;
  local_148.dims = 0;
  local_148.w = 0;
  local_148.h = 0;
  local_148.d = 0;
  local_148.c = 0;
  local_150 = this;
  local_e0 = (undefined1  [8])bottom_blobs;
  flatten(pMVar1 + 1,&local_148,opt);
  iVar11 = -100;
  local_148.elemsize = CONCAT44(local_148.elemsize._4_4_,(undefined4)local_148.elemsize);
  uStack_70 = CONCAT44(uStack_70._4_4_,(undefined4)uStack_70);
  if ((local_148.data == (void *)0x0) ||
     (local_148.elemsize = CONCAT44(local_148.elemsize._4_4_,(undefined4)local_148.elemsize),
     uStack_70 = CONCAT44(uStack_70._4_4_,(undefined4)uStack_70),
     (long)local_148.c * local_148.cstep == 0)) goto LAB_0029b688;
  local_148.w = local_148.w * local_148.elempack;
  local_148.elemsize =
       CONCAT44(local_148.elemsize._4_4_,(undefined4)local_148.elemsize) /
       (ulong)(long)local_148.elempack;
  local_148.elempack = 1;
  local_198.cstep = 0;
  uVar15 = local_1f0 * local_1ec;
  local_198.data = (void *)0x0;
  local_198.refcount._0_4_ = 0;
  local_198.refcount._4_4_ = 0;
  local_198.elemsize._0_4_ = 0;
  local_198.elemsize._4_4_ = 0;
  local_198.elempack = 0;
  local_198.allocator = (Allocator *)0x0;
  local_198.dims = 0;
  local_198.w = 0;
  local_198.h = 0;
  local_198.d = 0;
  local_198.c = 0;
  local_f0 = pMVar1;
  Mat::create(&local_198,i * uVar17 * uVar15,4,opt->workspace_allocator);
  iVar11 = -100;
  uStack_70 = CONCAT44(uStack_70._4_4_,(undefined4)uStack_70);
  if ((local_198.data != (void *)0x0) &&
     (uStack_70 = CONCAT44(uStack_70._4_4_,(undefined4)uStack_70),
     (long)local_198.c * local_198.cstep != 0)) {
    if (0 < (int)i) {
      uVar9 = (ulong)uVar15;
      uVar13 = 0;
      pvVar5 = local_198.data;
      pvVar8 = local_148.data;
      do {
        if (0 < (int)uVar17) {
          uVar10 = 0;
          pvVar12 = pvVar5;
          pvVar14 = pvVar8;
          do {
            if (0 < (int)uVar15) {
              uVar16 = 0;
              do {
                *(undefined4 *)((long)pvVar12 + uVar16 * 4) =
                     *(undefined4 *)((long)pvVar14 + uVar16 * 4);
                uVar16 = uVar16 + 1;
              } while (uVar9 != uVar16);
            }
            uVar10 = uVar10 + 1;
            pvVar12 = (void *)((long)pvVar12 + uVar9 * 4);
            pvVar14 = (void *)((long)pvVar14 + i * uVar9 * 4);
          } while (uVar10 != uVar17);
        }
        uVar13 = uVar13 + 1;
        pvVar5 = (void *)((long)pvVar5 + uVar17 * uVar9 * 4);
        pvVar8 = (void *)((long)pvVar8 + uVar9 * 4);
      } while (uVar13 != i);
    }
    local_1e8.cstep = 0;
    local_1e8.data = (void *)0x0;
    local_1e8.refcount._0_4_ = 0;
    local_1e8.refcount._4_4_ = 0;
    local_1e8.elemsize._0_4_ = 0;
    local_1e8.elemsize._4_4_ = 0;
    local_1e8.elemsize = 0;
    local_1e8.elempack = 0;
    local_1e8.allocator = (Allocator *)0x0;
    local_1e8.dims = 0;
    local_1e8.w = 0;
    local_1e8.h = 0;
    local_1e8.d = 0;
    local_1e8.c = 0;
    local_f8 = (undefined1  [8])opt;
    if ((local_150->super_Deconvolution).bias_term == 0) {
LAB_0029b184:
      pDVar4 = local_150;
      pLVar6 = create_layer_cpu(8);
      ParamDict::ParamDict(&local_200);
      ParamDict::set(&local_200,0,i);
      ParamDict::set(&local_200,1,local_1ec);
      ParamDict::set(&local_200,0xb,local_1f0);
      ParamDict::set(&local_200,2,(pDVar4->super_Deconvolution).dilation_w);
      ParamDict::set(&local_200,0xc,(pDVar4->super_Deconvolution).dilation_h);
      ParamDict::set(&local_200,3,(pDVar4->super_Deconvolution).stride_w);
      ParamDict::set(&local_200,0xd,(pDVar4->super_Deconvolution).stride_h);
      ParamDict::set(&local_200,4,(pDVar4->super_Deconvolution).pad_left);
      ParamDict::set(&local_200,0xf,(pDVar4->super_Deconvolution).pad_right);
      ParamDict::set(&local_200,0xe,(pDVar4->super_Deconvolution).pad_top);
      ParamDict::set(&local_200,0x10,(pDVar4->super_Deconvolution).pad_bottom);
      ParamDict::set(&local_200,0x12,(pDVar4->super_Deconvolution).output_pad_right);
      ParamDict::set(&local_200,0x13,(pDVar4->super_Deconvolution).output_pad_bottom);
      ParamDict::set(&local_200,0x14,(pDVar4->super_Deconvolution).output_w);
      ParamDict::set(&local_200,0x15,(pDVar4->super_Deconvolution).output_h);
      ParamDict::set(&local_200,5,(pDVar4->super_Deconvolution).bias_term);
      ParamDict::set(&local_200,6,local_198.w);
      ParamDict::set(&local_200,9,(pDVar4->super_Deconvolution).activation_type);
      ParamDict::set(&local_200,10,&(pDVar4->super_Deconvolution).activation_params);
      (*pLVar6->_vptr_Layer[2])(pLVar6,&local_200);
      lVar7 = 0x40;
      do {
        *(undefined8 *)((long)&local_c8.data + lVar7) = 0;
        *(undefined8 *)(auStack_100 + lVar7 + -8) = 0;
        *(undefined8 *)(auStack_100 + lVar7) = 0;
        *(undefined8 *)(auStack_100 + lVar7 + 4) = 0;
        *(undefined8 *)(local_f8 + lVar7 + 4) = 0;
        *(undefined8 *)((long)&local_e8 + lVar7) = 0;
        *(undefined8 *)(local_e0 + lVar7) = 0;
        *(undefined8 *)(local_e0 + lVar7 + 4) = 0;
        *(undefined8 *)((long)&local_d8 + lVar7 + 4) = 0;
        lVar7 = lVar7 + 0x48;
      } while (lVar7 != 0xd0);
      piVar2 = (int *)CONCAT44(local_198.refcount._4_4_,local_198.refcount._0_4_);
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + 1;
        UNLOCK();
      }
      piVar2 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          if (local_c8.allocator == (Allocator *)0x0) {
            if (local_c8.data != (void *)0x0) {
              free(local_c8.data);
            }
          }
          else {
            (*(local_c8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      local_c8.data = local_198.data;
      local_c8.refcount._0_4_ = local_198.refcount._0_4_;
      local_c8.refcount._4_4_ = local_198.refcount._4_4_;
      local_c8.elemsize._0_4_ = (undefined4)local_198.elemsize;
      local_c8.elemsize._4_4_ = local_198.elemsize._4_4_;
      local_c8.elempack = local_198.elempack;
      local_c8.allocator = local_198.allocator;
      local_c8.dims = local_198.dims;
      local_c8.w = local_198.w;
      local_c8.h = local_198.h;
      local_c8.d = local_198.d;
      local_c8.c = local_198.c;
      local_c8.cstep = local_198.cstep;
      piVar2 = (int *)CONCAT44(local_1e8.refcount._4_4_,local_1e8.refcount._0_4_);
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + 1;
        UNLOCK();
      }
      piVar2 = (int *)CONCAT44(uStack_74,uStack_78);
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          if (local_60 == (Allocator *)0x0) {
            if (local_80 != (void *)0x0) {
              free(local_80);
            }
          }
          else {
            (*local_60->_vptr_Allocator[3])();
          }
        }
      }
      local_80 = local_1e8.data;
      uStack_78 = local_1e8.refcount._0_4_;
      uStack_74 = local_1e8.refcount._4_4_;
      iStack_68 = local_1e8.elempack;
      local_60 = local_1e8.allocator;
      local_58 = CONCAT44(local_1e8.w,local_1e8.dims);
      uStack_50 = CONCAT44(local_1e8.d,local_1e8.h);
      local_48 = local_1e8.c;
      local_40 = local_1e8.cstep;
      uStack_70 = local_1e8.elemsize;
      ModelBinFromMatArray::ModelBinFromMatArray(&local_d8,&local_c8);
      (*pLVar6->_vptr_Layer[3])(pLVar6,&local_d8);
      ModelBinFromMatArray::~ModelBinFromMatArray(&local_d8);
      (*pLVar6->_vptr_Layer[4])(pLVar6,opt);
      (*pLVar6->_vptr_Layer[7])(pLVar6,local_f0,local_e8,opt);
      (*pLVar6->_vptr_Layer[5])(pLVar6,opt);
      (*pLVar6->_vptr_Layer[1])(pLVar6);
      lVar7 = 0x48;
      do {
        piVar2 = *(int **)((long)&local_c8.refcount + lVar7);
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (*piVar2 == 0) {
            pvVar5 = *(void **)((long)&local_c8.data + lVar7);
            plVar3 = *(long **)((long)&local_c8.allocator + lVar7);
            if (plVar3 == (long *)0x0) {
              if (pvVar5 != (void *)0x0) {
                free(pvVar5);
              }
            }
            else {
              (**(code **)(*plVar3 + 0x18))();
            }
          }
        }
        *(undefined8 *)((long)&local_c8.cstep + lVar7) = 0;
        *(undefined8 *)((long)&local_c8.refcount + lVar7 + 4) = 0;
        *(undefined8 *)((long)&local_c8.elemsize + lVar7 + 4) = 0;
        *(undefined8 *)((long)&local_c8.data + lVar7) = 0;
        *(undefined8 *)((long)&local_c8.refcount + lVar7) = 0;
        *(undefined8 *)((long)&local_c8.dims + lVar7) = 0;
        *(undefined8 *)((long)&local_c8.h + lVar7) = 0;
        *(undefined4 *)((long)&local_c8.c + lVar7) = 0;
        lVar7 = lVar7 + -0x48;
      } while (lVar7 != -0x48);
      ParamDict::~ParamDict(&local_200);
      iVar11 = 0;
    }
    else {
      flatten((((_Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)local_e0)->_M_impl).
              super__Vector_impl_data._M_start + 2,&local_1e8,opt);
      iVar11 = -100;
      local_1e8.elemsize = CONCAT44(local_1e8.elemsize._4_4_,(undefined4)local_1e8.elemsize);
      uStack_70 = CONCAT44(uStack_70._4_4_,(undefined4)uStack_70);
      if ((local_1e8.data != (void *)0x0) &&
         (local_1e8.elemsize = CONCAT44(local_1e8.elemsize._4_4_,(undefined4)local_1e8.elemsize),
         uStack_70 = CONCAT44(uStack_70._4_4_,(undefined4)uStack_70),
         (long)local_1e8.c * local_1e8.cstep != 0)) {
        local_1e8.w = local_1e8.w * local_1e8.elempack;
        local_1e8.elemsize =
             CONCAT44(local_1e8.elemsize._4_4_,(undefined4)local_1e8.elemsize) /
             (ulong)(long)local_1e8.elempack;
        local_1e8.elempack = 1;
        goto LAB_0029b184;
      }
    }
    piVar2 = (int *)CONCAT44(local_1e8.refcount._4_4_,local_1e8.refcount._0_4_);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (local_1e8.allocator == (Allocator *)0x0) {
          if (local_1e8.data != (void *)0x0) {
            free(local_1e8.data);
          }
        }
        else {
          (*(local_1e8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    local_1e8.cstep = 0;
    local_1e8.data = (void *)0x0;
    local_1e8.refcount._0_4_ = 0;
    local_1e8.refcount._4_4_ = 0;
    local_1e8.elemsize._0_4_ = 0;
    local_1e8.elemsize._4_4_ = 0;
    local_1e8.elempack = 0;
    local_1e8.dims = 0;
    local_1e8.w = 0;
    local_1e8.h = 0;
    local_1e8.d = 0;
    local_1e8.c = 0;
  }
  piVar2 = (int *)CONCAT44(local_198.refcount._4_4_,local_198.refcount._0_4_);
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 == 0) {
      if (local_198.allocator == (Allocator *)0x0) {
        if (local_198.data != (void *)0x0) {
          free(local_198.data);
        }
      }
      else {
        (*(local_198.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  local_198.cstep = 0;
  local_198.data = (void *)0x0;
  local_198.refcount._0_4_ = 0;
  local_198.refcount._4_4_ = 0;
  local_198.elemsize._0_4_ = 0;
  local_198.elemsize._4_4_ = 0;
  local_198.elempack = 0;
  local_198.dims = 0;
  local_198.w = 0;
  local_198.h = 0;
  local_198.d = 0;
  local_198.c = 0;
LAB_0029b688:
  piVar2 = (int *)CONCAT44(local_148.refcount._4_4_,local_148.refcount._0_4_);
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 == 0) {
      if (local_148.allocator == (Allocator *)0x0) {
        if (local_148.data != (void *)0x0) {
          free(local_148.data);
        }
      }
      else {
        (*(local_148.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar11;
}

Assistant:

int Deconvolution_x86::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    const Mat& _weight_data = bottom_blobs[1];
    Mat& top_blob = top_blobs[0];

    const int _num_input = bottom_blob.c * bottom_blob.elempack;
    const int _kernel_w = _weight_data.w;
    const int _kernel_h = _weight_data.h;
    const int _num_output = _weight_data.d * 1;

    Mat weight_data_flattened;
    flatten(_weight_data, weight_data_flattened, opt);
    if (weight_data_flattened.empty())
        return -100;

    // weight_data_flattened as pack1
    weight_data_flattened.w *= weight_data_flattened.elempack;
    weight_data_flattened.elemsize /= weight_data_flattened.elempack;
    weight_data_flattened.elempack = 1;

    // transpose group-inch/group-outch/group-kh-kw to group-outch/group-inch/group-kh-kw
    Mat weight_data_transposed;
    {
        weight_data_transposed.create(_kernel_w * _kernel_h * _num_output * _num_input / 1, 4u, opt.workspace_allocator);
        if (weight_data_transposed.empty())
            return -100;

        const int outch_g = _num_output / 1;
        const int inch_g = _num_input / 1;
        const int maxk = _kernel_h * _kernel_w;

        for (int g = 0; g < 1; g++)
        {
            // reorder weight from inch-outch to outch-inch
            float* wg2 = (float*)weight_data_transposed + g * outch_g * inch_g * maxk;
            const float* wg = (const float*)weight_data_flattened + g * inch_g * outch_g * maxk;
            for (int i = 0; i < outch_g; i++)
            {
                for (int j = 0; j < inch_g; j++)
                {
                    for (int k = 0; k < maxk; k++)
                    {
                        wg2[(i * inch_g + j) * maxk + k] = wg[(j * outch_g + i) * maxk + k];
                    }
                }
            }
        }
    }

    Mat bias_data_flattened;
    if (bias_term)
    {
        const Mat& _bias_data = bottom_blobs[2];
        flatten(_bias_data, bias_data_flattened, opt);
        if (bias_data_flattened.empty())
            return -100;

        // bias_data_flattened as pack1
        bias_data_flattened.w *= bias_data_flattened.elempack;
        bias_data_flattened.elemsize /= bias_data_flattened.elempack;
        bias_data_flattened.elempack = 1;
    }

    ncnn::Layer* op = ncnn::create_layer_cpu(ncnn::LayerType::Deconvolution);

    ncnn::ParamDict pd;
    pd.set(0, _num_output);
    pd.set(1, _kernel_w);
    pd.set(11, _kernel_h);
    pd.set(2, dilation_w);
    pd.set(12, dilation_h);
    pd.set(3, stride_w);
    pd.set(13, stride_h);
    pd.set(4, pad_left);
    pd.set(15, pad_right);
    pd.set(14, pad_top);
    pd.set(16, pad_bottom);
    pd.set(18, output_pad_right);
    pd.set(19, output_pad_bottom);
    pd.set(20, output_w);
    pd.set(21, output_h);
    pd.set(5, bias_term);
    pd.set(6, weight_data_transposed.w);
    pd.set(9, activation_type);
    pd.set(10, activation_params);

    op->load_param(pd);

    ncnn::Mat weights[2];
    weights[0] = weight_data_transposed;
    weights[1] = bias_data_flattened;

    op->load_model(ncnn::ModelBinFromMatArray(weights));

    op->create_pipeline(opt);

    op->forward(bottom_blob, top_blob, opt);

    op->destroy_pipeline(opt);

    delete op;

    return 0;
}